

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O1

VarType * __thiscall
deqp::gls::RandomUniformBlockCase::generateType
          (VarType *__return_storage_ptr__,RandomUniformBlockCase *this,Random *rnd,int typeDepth,
          bool arrayOk)

{
  DataType basicType;
  RandomUniformBlockCase *this_00;
  VarType *pVVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  DataType flags;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  int ndx;
  undefined7 in_register_00000081;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  VarType elementType;
  DataType val;
  vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_> memberTypes;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  local_d8;
  Data DStack_d0;
  long lStack_c0;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8 [2];
  RandomUniformBlockCase *local_98;
  deUint32 local_8c;
  deRandom *local_88;
  StructType *local_80;
  string local_78;
  vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_> local_58;
  VarType *local_40;
  ulong local_38;
  
  ndx = (int)CONCAT71(in_register_00000081,arrayOk);
  local_98 = this;
  if ((this->m_maxStructDepth <= typeDepth) ||
     (fVar15 = deRandom_getFloat(&rnd->m_rnd), 0.1 <= fVar15)) {
    if ((arrayOk && 0 < local_98->m_maxArrayLength) &&
       (fVar15 = deRandom_getFloat(&rnd->m_rnd), this_00 = local_98, fVar15 < 0.1)) {
      dVar2 = local_98->m_features;
      uVar14 = local_98->m_maxArrayLength;
      dVar3 = deRandom_getUint32(&rnd->m_rnd);
      generateType((VarType *)&local_d8,this_00,rnd,typeDepth,SUB21((ushort)(short)dVar2 >> 0xf,0));
      ub::VarType::VarType(__return_storage_ptr__,(VarType *)&local_d8,dVar3 % uVar14 + 1);
      ub::VarType::~VarType((VarType *)&local_d8);
      return __return_storage_ptr__;
    }
    local_d8._M_current = (DataType *)0x0;
    DStack_d0.array.elementType = (VarType *)0x0;
    DStack_d0._8_8_ = (VarType *)0x0;
    local_b8._0_4_ = 1;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,(iterator)0x0,
               (DataType *)&local_b8);
    local_b8._0_4_ = 0x1b;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x1b;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    local_b8._0_4_ = 0x1f;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x1f;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    local_b8._0_4_ = 0x23;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x23;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    if ((local_98->m_features & 1) != 0) {
      local_b8._0_4_ = 2;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = TYPE_STRUCT;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 3;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = TYPE_LAST;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 4;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 4;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1c;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1c;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1d;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1d;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1e;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1e;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x20;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x20;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x21;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x21;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x22;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x22;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x24;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x24;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x25;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x25;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x26;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x26;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
    }
    if ((local_98->m_features & 2) != 0) {
      local_b8._0_4_ = 5;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 5;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 6;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 6;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 8;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 8;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 9;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 9;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 10;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 10;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xb;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xb;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xc;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xc;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xd;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xd;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
    }
    local_b8._0_4_ = TYPE_INVALID;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,glu::DataType*>
              (rnd,local_d8,
               (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                )DStack_d0.array.elementType,(DataType *)&local_b8,1);
    basicType = (DataType)local_b8;
    flags = TYPE_INVALID;
    if (3 < (DataType)local_b8 - TYPE_BOOL) {
      local_b8._0_4_ = TYPE_INVALID;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,generateType::precisionCandidates,(uint *)"N4deqp3gls22RandomUniformBlockCaseE"
                 ,(uint *)&local_b8,1);
      flags = (DataType)local_b8;
    }
    ub::VarType::VarType(__return_storage_ptr__,basicType,flags);
    if (local_d8._M_current == (DataType *)0x0) {
      return __return_storage_ptr__;
    }
    operator_delete(local_d8._M_current,DStack_d0._8_8_ - (long)local_d8._M_current);
    return __return_storage_ptr__;
  }
  local_8c = local_98->m_features;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = local_98->m_maxStructMembers;
  local_40 = __return_storage_ptr__;
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  iVar12 = 0;
  local_38 = (ulong)dVar2 % (ulong)uVar14;
  iVar10 = (uint)local_38 + 1;
  if ((uint)local_38 < 0x7fffffff) {
    do {
      ndx = 1;
      generateType((VarType *)&local_d8,local_98,rnd,typeDepth + 1,true);
      std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::
      emplace_back<deqp::gls::ub::VarType>(&local_58,(VarType *)&local_d8);
      ub::VarType::~VarType((VarType *)&local_d8);
      iVar12 = iVar12 + 1;
    } while (iVar12 < iVar10);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"s","");
  genName_abi_cxx11_(&local_78,(gls *)0x41,'Z',(char)local_98->m_structNdx,ndx);
  uVar8 = 0xf;
  if (local_b8 != local_a8) {
    uVar8 = local_a8[0];
  }
  if (uVar8 < local_78._M_string_length + local_b0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar9 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_b0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
      goto LAB_018d46bc;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
LAB_018d46bc:
  local_d8._M_current = (DataType *)&DStack_d0.array.size;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    DStack_d0._8_8_ = *plVar5;
    lStack_c0 = puVar4[3];
  }
  else {
    DStack_d0._8_8_ = *plVar5;
    local_d8._M_current = (DataType *)*puVar4;
  }
  DStack_d0.array.elementType = (VarType *)puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  local_80 = ub::ShaderInterface::allocStruct
                       (&(local_98->super_UniformBlockCase).m_interface,(char *)local_d8._M_current)
  ;
  if (local_d8._M_current != (DataType *)&DStack_d0.array.size) {
    operator_delete(local_d8._M_current,DStack_d0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_88 = &rnd->m_rnd;
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_98->m_structNdx = local_98->m_structNdx + 1;
  if ((uint)local_38 < 0x7fffffff) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      uVar14 = 0;
      if ((local_8c >> 10 & 1) != 0) {
        fVar15 = deRandom_getFloat(local_88);
        uVar14 = (uint)(fVar15 < 0.15) << 10;
      }
      uVar7 = 0;
      if ((local_8c >> 10 & 1) != 0) {
        fVar15 = deRandom_getFloat(local_88);
        uVar7 = (uint)(fVar15 < 0.15) << 0xb;
      }
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"m","");
      plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
      local_d8._M_current = (DataType *)&DStack_d0.array.size;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        DStack_d0._8_8_ = *plVar6;
        lStack_c0 = plVar5[3];
      }
      else {
        DStack_d0._8_8_ = *plVar6;
        local_d8._M_current = (DataType *)*plVar5;
      }
      DStack_d0.array.elementType = (VarType *)plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ub::StructType::addMember
                (local_80,(char *)local_d8._M_current,
                 (VarType *)
                 ((long)&(local_58.
                          super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar13),
                 uVar7 | uVar14);
      if (local_d8._M_current != (DataType *)&DStack_d0.array.size) {
        operator_delete(local_d8._M_current,DStack_d0._8_8_ + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar11 < iVar10);
  }
  pVVar1 = local_40;
  ub::VarType::VarType(local_40,local_80);
  std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::~vector(&local_58);
  return pVVar1;
}

Assistant:

VarType RandomUniformBlockCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk)
{
	const float structWeight	= 0.1f;
	const float arrayWeight		= 0.1f;

	if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		const float		unusedVtxWeight		= 0.15f;
		const float		unusedFragWeight	= 0.15f;
		bool			unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<VarType>	memberTypes;
		int				numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true));

		StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			deUint32 flags = 0;

			flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
			flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx], flags);
		}

		return VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const bool	arraysOfArraysOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const int	arrayLength			= rnd.getInt(1, m_maxArrayLength);
		VarType	elementType	= generateType(rnd, typeDepth, arraysOfArraysOk);
		return VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type	= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		deUint32		flags	= 0;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const deUint32 precisionCandidates[] = { PRECISION_LOW, PRECISION_MEDIUM, PRECISION_HIGH };
			flags |= rnd.choose<deUint32>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}

		return VarType(type, flags);
	}
}